

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O2

void __thiscall SimpleVendor::Vend(SimpleVendor *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = ProcessUserInput(this);
  if (bVar3) {
    (**(code **)(*(long *)this->vio + 0x18))(this->vio,(this->super_Vendor).balance_);
    iVar1 = (this->super_Vendor).kPrice;
    iVar2 = (this->super_Vendor).balance_;
    if (iVar2 < iVar1) {
      (**(code **)(*(long *)this->vio + 0x28))(this->vio,iVar1 - iVar2);
    }
    else {
      (this->super_Vendor).balance_ = iVar2 - iVar1;
      (**(code **)(*(long *)this->vio + 0x20))();
      DispenseChange(this);
    }
    (*(this->super_Vendor)._vptr_Vendor[1])(this);
    return;
  }
  return;
}

Assistant:

void SimpleVendor::Vend() {
    if (!ProcessUserInput()) return; // if user wants to quit, break out of our recursion
    vio->PrintBalance(GetBalance());
    if (GetBalance() >= GetPrice()) {
        SetBalance(GetBalance() - GetPrice());
        vio->PrintThankYouMessage();
        DispenseChange();
    } else vio->PrintMoreCoinsNeeded(GetPrice() - GetBalance());
    return Vend(); // recursive call
}